

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint16_t quantize(float dctval,float errorTolerance)

{
  unsigned_short uVar1;
  uint16_t src_00;
  float fVar2;
  float fVar3;
  float in_XMM1_Da;
  int targetNumSetBits;
  uint16_t *closest;
  int numSetBits;
  float srcFloat;
  uint16_t src;
  uint16_t tmp;
  int local_24;
  unsigned_short *local_20;
  
  src_00 = float_to_half(0.0);
  fVar2 = half_to_float(0);
  local_24 = countSetBits(src_00);
  local_20 = closestData + closestDataOffset[src_00];
  while( true ) {
    local_24 = local_24 + -1;
    if (local_24 < 0) {
      return src_00;
    }
    uVar1 = *local_20;
    fVar3 = half_to_float(0);
    if (ABS(fVar3 - fVar2) < in_XMM1_Da) break;
    local_20 = local_20 + 1;
  }
  return uVar1;
}

Assistant:

static inline uint16_t
quantize (float dctval, float errorTolerance)
{
    uint16_t tmp;
    // pre-quantize float -> half and back
    uint16_t src      = float_to_half (dctval);
    float    srcFloat = half_to_float (src);

    int             numSetBits = countSetBits (src);
    const uint16_t* closest    = closestData + closestDataOffset[src];

    for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
         --targetNumSetBits)
    {
        tmp = *closest;

        if (fabsf (half_to_float (tmp) - srcFloat) < errorTolerance) return tmp;

        closest++;
    }

    return src;
}